

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          FixedArray<char,_1UL> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3)

{
  size_t sVar1;
  char *pcVar2;
  
  heapString(__return_storage_ptr__,
             params_2->size_ + 1 + *(long *)(this + 8) + *(long *)(params_1 + 8));
  pcVar2 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)(this + 8);
  if (sVar1 != 0) {
    memcpy(pcVar2,*(void **)this,sVar1);
    pcVar2 = pcVar2 + sVar1;
  }
  *pcVar2 = *(char *)&params->ptr;
  pcVar2 = pcVar2 + 1;
  sVar1 = *(size_t *)(params_1 + 8);
  if (sVar1 != 0) {
    memcpy(pcVar2,*(void **)params_1,sVar1);
    pcVar2 = pcVar2 + sVar1;
  }
  if (params_2->size_ != 0) {
    memcpy(pcVar2,params_2->ptr,params_2->size_);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}